

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

intptr_t fio_socket(char *address,char *port,uint8_t server)

{
  int64_t iVar1;
  int *piVar2;
  int64_t n;
  char *pos;
  intptr_t uuid;
  char *pcStack_20;
  uint8_t server_local;
  char *port_local;
  char *address_local;
  
  uuid._7_1_ = server;
  pcStack_20 = port;
  port_local = address;
  if (port != (char *)0x0) {
    n = (int64_t)port;
    iVar1 = fio_atol((char **)&n);
    if (*(char *)n != '\0') {
      if (1 < FIO_LOG_LEVEL) {
        FIO_LOG2STDERR("ERROR: (fio_socket) port %s is not a number.",pcStack_20);
      }
      piVar2 = __errno_location();
      *piVar2 = 0x16;
      return -1;
    }
    if (iVar1 < 1) {
      if ((iVar1 < -1) && (2 < FIO_LOG_LEVEL)) {
        FIO_LOG2STDERR("WARNING: (fio_socket) negative port number %s is ignored.",pcStack_20);
      }
      pcStack_20 = (char *)0x0;
    }
  }
  if ((port_local == (char *)0x0) && (pcStack_20 == (char *)0x0)) {
    if (1 < FIO_LOG_LEVEL) {
      FIO_LOG2STDERR("ERROR: (fio_socket) both address and port are missing or invalid.");
    }
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    address_local = (char *)0xffffffffffffffff;
  }
  else {
    if (pcStack_20 == (char *)0x0) {
      do {
        piVar2 = __errno_location();
        *piVar2 = 0;
        pos = (char *)fio_unix_socket(port_local,uuid._7_1_);
        piVar2 = __errno_location();
      } while (*piVar2 == 4);
    }
    else {
      do {
        piVar2 = __errno_location();
        *piVar2 = 0;
        pos = (char *)fio_tcp_socket(port_local,pcStack_20,uuid._7_1_);
        piVar2 = __errno_location();
      } while (*piVar2 == 4);
    }
    address_local = pos;
  }
  return (intptr_t)address_local;
}

Assistant:

intptr_t fio_socket(const char *address, const char *port, uint8_t server) {
  intptr_t uuid;
  if (port) {
    char *pos = (char *)port;
    int64_t n = fio_atol(&pos);
    /* make sure port is only numerical */
    if (*pos) {
      FIO_LOG_ERROR("(fio_socket) port %s is not a number.", port);
      errno = EINVAL;
      return -1;
    }
    /* a negative port number will revert to a Unix socket. */
    if (n <= 0) {
      if (n < -1)
        FIO_LOG_WARNING("(fio_socket) negative port number %s is ignored.",
                        port);
      port = NULL;
    }
  }
  if (!address && !port) {
    FIO_LOG_ERROR("(fio_socket) both address and port are missing or invalid.");
    errno = EINVAL;
    return -1;
  }
  if (!port) {
    do {
      errno = 0;
      uuid = fio_unix_socket(address, server);
    } while (errno == EINTR);
  } else {
    do {
      errno = 0;
      uuid = fio_tcp_socket(address, port, server);
    } while (errno == EINTR);
  }
  return uuid;
}